

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# src_backend_parser_parser.cpp
# Opt level: O2

vector<duckdb_libpgquery::PGKeyword,_std::allocator<duckdb_libpgquery::PGKeyword>_> *
duckdb_libpgquery::keyword_list(void)

{
  vector<duckdb_libpgquery::PGKeyword,_std::allocator<duckdb_libpgquery::PGKeyword>_> *in_RDI;
  long lVar1;
  PGKeyword keyword;
  
  (in_RDI->
  super__Vector_base<duckdb_libpgquery::PGKeyword,_std::allocator<duckdb_libpgquery::PGKeyword>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (in_RDI->
  super__Vector_base<duckdb_libpgquery::PGKeyword,_std::allocator<duckdb_libpgquery::PGKeyword>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (in_RDI->
  super__Vector_base<duckdb_libpgquery::PGKeyword,_std::allocator<duckdb_libpgquery::PGKeyword>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (lVar1 = 10; lVar1 != 0x1e3a; lVar1 = lVar1 + 0x10) {
    keyword.text._M_string_length = 0;
    keyword.text.field_2._M_local_buf[0] = '\0';
    keyword.text._M_dataplus._M_p = (pointer)&keyword.text.field_2;
    std::__cxx11::string::assign((char *)&keyword);
    if (*(ushort *)((long)&ScanKeywords + lVar1) < 4) {
      keyword.category = (PGKeywordCategory)*(ushort *)((long)&ScanKeywords + lVar1);
    }
    std::vector<duckdb_libpgquery::PGKeyword,_std::allocator<duckdb_libpgquery::PGKeyword>_>::
    push_back(in_RDI,&keyword);
    std::__cxx11::string::~string((string *)&keyword);
  }
  return in_RDI;
}

Assistant:

std::vector<PGKeyword> keyword_list() {
    std::vector<PGKeyword> result;
	for(size_t i = 0; i < NumScanKeywords; i++) {
		PGKeyword keyword;
		keyword.text = ScanKeywords[i].name;
		switch(ScanKeywords[i].category) {
		case UNRESERVED_KEYWORD:
			keyword.category = PGKeywordCategory::PG_KEYWORD_UNRESERVED;
			break;
		case RESERVED_KEYWORD:
			keyword.category = PGKeywordCategory::PG_KEYWORD_RESERVED;
			break;
		case TYPE_FUNC_NAME_KEYWORD:
			keyword.category = PGKeywordCategory::PG_KEYWORD_TYPE_FUNC;
			break;
		case COL_NAME_KEYWORD:
			keyword.category = PGKeywordCategory::PG_KEYWORD_COL_NAME;
			break;
		}
		result.push_back(keyword);
	}
	return result;
}